

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mm_manager.c
# Opt level: O0

void generate_call_in_parameters(mm_context_t *context,uint8_t **buffer,size_t *len)

{
  dlog_mt_call_in_params_t *call_in_params;
  byte local_71;
  undefined1 local_70 [7];
  uint8_t call_in_hour;
  tm ptm;
  time_t rawtime;
  uint8_t *pbuffer;
  dlog_mt_call_in_params_t *pcall_in_params;
  size_t *len_local;
  uint8_t **buffer_local;
  mm_context_t *context_local;
  
  memset(local_70,0,0x38);
  *len = 0x15;
  call_in_params = (dlog_mt_call_in_params_t *)calloc(1,*len);
  if (call_in_params == (dlog_mt_call_in_params_t *)0x0) {
    fprintf(_stderr,"%s: Error allocating %zu bytes of memory\n","generate_call_in_parameters",*len)
    ;
    mm_shutdown(context);
    exit(-0xc);
  }
  printf("\nGenerating Call-In table:\n");
  call_in_params->id = '#';
  mm_time((uint)context->test_mode,(time_t *)&ptm.tm_zone);
  localtime_r((time_t *)&ptm.tm_zone,(tm *)local_70);
  local_71 = (byte)ptm.tm_sec;
  if (0xb < (byte)ptm.tm_sec) {
    local_71 = (byte)ptm.tm_sec - 0xc;
  }
  call_in_params->call_in_start_date[0] = (uint8_t)ptm.tm_mday;
  call_in_params->call_in_start_date[1] = (char)ptm.tm_hour + '\x01';
  call_in_params->call_in_start_date[2] = (uint8_t)ptm.tm_min;
  call_in_params->call_in_start_time[0] = local_71;
  call_in_params->call_in_start_time[1] = local_70[4];
  call_in_params->call_in_start_time[2] = local_70[0];
  call_in_params->call_in_interval[0] = '\0';
  call_in_params->call_in_interval[1] = '\f';
  call_in_params->call_in_interval[2] = '\0';
  call_in_params->call_back_retry_time[0] = '\x0f';
  call_in_params->call_back_retry_time[1] = '\0';
  call_in_params->cdr_threshold = '\x1e';
  call_in_params->call_in_expiration_date[0] = (uint8_t)ptm.tm_mday + '\x01';
  call_in_params->call_in_expiration_date[1] = (char)ptm.tm_hour + '\x01';
  call_in_params->call_in_expiration_date[2] = (uint8_t)ptm.tm_min;
  call_in_params->call_in_expiration_time[0] = '\x02';
  call_in_params->call_in_expiration_time[1] = '\0';
  call_in_params->call_in_expiration_time[2] = '\0';
  call_in_params->unknown[0] = '\0';
  call_in_params->unknown[1] = '\0';
  print_call_in_params_table(call_in_params);
  *buffer = (uint8_t *)call_in_params;
  return;
}

Assistant:

static void generate_call_in_parameters(mm_context_t *context, uint8_t **buffer, size_t *len) {
    dlog_mt_call_in_params_t *pcall_in_params;
    uint8_t  *pbuffer;
    time_t    rawtime;
    struct tm ptm = { 0 };
    uint8_t   call_in_hour;

    *len    = sizeof(dlog_mt_call_in_params_t);
    pbuffer = (uint8_t*)calloc(1, *len);

    if (pbuffer == NULL) {
        fprintf(stderr, "%s: Error allocating %zu bytes of memory\n", __func__, *len);
        mm_shutdown(context);
        exit(-ENOMEM);
    }

    pcall_in_params = (dlog_mt_call_in_params_t *)pbuffer;

    printf("\nGenerating Call-In table:\n");

    pcall_in_params->id = DLOG_MT_CALL_IN_PARMS;

    mm_time(context->test_mode, &rawtime);
    localtime_r(&rawtime, &ptm);

    /* Interestingly, the terminal will call in starting at the call-in time, and continue
     * calling in at intervals specified, up until midnight.  After that, the terminal will
     * not call in until the call-in time the following day.  Since we want to call in twice
     * a day, set the call-in hour to a time in the AM, so the subsequent call 12 hours later
     * will be in the PM of the same day.
     */
    call_in_hour = (ptm.tm_hour & 0xff);

    if (call_in_hour >= 12) { /* If after noon, set back to the AM. */
        call_in_hour -= 12;
    }

    pcall_in_params->call_in_start_date[0]      = (ptm.tm_year & 0xff);       /* Call-in start YY */
    pcall_in_params->call_in_start_date[1]      = ((ptm.tm_mon + 1) & 0xff);  /* Call in start MM */
    pcall_in_params->call_in_start_date[2]      = (ptm.tm_mday & 0xff);       /* Call in start DD */
    pcall_in_params->call_in_start_time[0]      = call_in_hour;               /* Call-in start HH */
    pcall_in_params->call_in_start_time[1]      = (ptm.tm_min & 0xff);        /* Call-in start MM */
    pcall_in_params->call_in_start_time[2]      = (ptm.tm_sec & 0xff);        /* Call-in start SS */
    pcall_in_params->call_in_interval[0]        = 0;                          /* Call-in inteval DD */
    pcall_in_params->call_in_interval[1]        = 12;                         /* Call-in inteval HH */
    pcall_in_params->call_in_interval[2]        = 0;                          /* Call-in inteval MM */
    pcall_in_params->call_back_retry_time[0]    = 15;                         /* Call-back retry time MM */
    pcall_in_params->call_back_retry_time[1]    = 0;                          /* Call-back retry time SS */
    pcall_in_params->cdr_threshold              = 30;                         /* Indicates the number of CDRs that the terminal will store before automatically calling in to the Millennium Manager to upload them. (Range: 1-50) */
    pcall_in_params->call_in_expiration_date[0] = ((ptm.tm_year + 1) & 0xff); /* Expiration timestamp YY */
    pcall_in_params->call_in_expiration_date[1] = ((ptm.tm_mon + 1) & 0xff);  /* Expiration timestamp MM */
    pcall_in_params->call_in_expiration_date[2] = (ptm.tm_mday & 0xff);       /* Expiration timestamp DD */
    pcall_in_params->call_in_expiration_time[0] = 2;                          /* Expiration timestamp HH */
    pcall_in_params->call_in_expiration_time[1] = 0;                          /* Expiration timestamp MM */
    pcall_in_params->call_in_expiration_time[2] = 0;                          /* Expiration timestamp SS */
    pcall_in_params->unknown[0]                 = 0;
    pcall_in_params->unknown[1]                 = 0;

    print_call_in_params_table(pcall_in_params);

    *buffer = pbuffer;
}